

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::pid_formatter::format
          (pid_formatter *this,log_msg *param_2,tm *param_3,memory_buffer *dest)

{
  bool bVar1;
  long in_RDI;
  scoped_pad p;
  uint field_size;
  uint32_t pid;
  scoped_pad *in_stack_ffffffffffffffa0;
  memory_buffer *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  scoped_pad *in_stack_ffffffffffffffc0;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd4;
  
  os::pid();
  bVar1 = padding_info::enabled((padding_info *)(in_RDI + 8));
  if (bVar1) {
    fmt_helper::count_digits<unsigned_int>(0);
    scoped_pad::scoped_pad
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    fmt_helper::append_int<unsigned_int,500ul>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
    scoped_pad::~scoped_pad(in_stack_ffffffffffffffa0);
  }
  else {
    fmt_helper::append_int<unsigned_int,500ul>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, fmt::memory_buffer &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        if (padinfo_.enabled())
        {
            auto field_size = fmt_helper::count_digits(pid);
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::append_int(pid, dest);
        }
        else
        {
            fmt_helper::append_int(pid, dest);
        }
    }